

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathRect(ImDrawList *this,ImVec2 *a,ImVec2 *b,float rounding,int rounding_corners)

{
  int iVar1;
  ImVec2 *pIVar2;
  uint uVar3;
  ImVec2 *pIVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float radius;
  ImVec2 local_38;
  
  uVar3 = ~rounding_corners;
  fVar8 = 0.5;
  if ((uVar3 & 0xc) != 0) {
    fVar8 = 1.0;
  }
  fVar9 = 0.5;
  if ((uVar3 & 3) != 0) {
    fVar9 = fVar8;
  }
  fVar8 = 0.5;
  if ((uVar3 & 6) != 0) {
    fVar8 = 1.0;
  }
  fVar7 = 0.5;
  if ((uVar3 & 9) != 0) {
    fVar7 = fVar8;
  }
  if (rounding_corners != 0) {
    fVar8 = ABS(b->x - a->x) * fVar9 + -1.0;
    if (fVar8 <= rounding) {
      rounding = fVar8;
    }
    fVar8 = ABS(b->y - a->y) * fVar7 + -1.0;
    if (fVar8 <= rounding) {
      rounding = fVar8;
    }
    if (0.0 < rounding) {
      fVar8 = 0.0;
      if ((rounding_corners & 1U) != 0) {
        fVar8 = rounding;
      }
      fVar9 = 0.0;
      if ((rounding_corners & 2U) != 0) {
        fVar9 = rounding;
      }
      fVar7 = 0.0;
      if ((rounding_corners & 4U) != 0) {
        fVar7 = rounding;
      }
      radius = 0.0;
      if ((rounding_corners & 8U) != 0) {
        radius = rounding;
      }
      local_38.x = a->x + fVar8;
      local_38.y = a->y + fVar8;
      PathArcToFast(this,&local_38,fVar8,6,9);
      local_38.x = b->x - fVar9;
      local_38.y = a->y + fVar9;
      PathArcToFast(this,&local_38,fVar9,9,0xc);
      local_38.x = b->x - fVar7;
      local_38.y = b->y - fVar7;
      PathArcToFast(this,&local_38,fVar7,0,3);
      local_38.x = a->x + radius;
      local_38.y = b->y - radius;
      PathArcToFast(this,&local_38,radius,3,6);
      return;
    }
  }
  iVar6 = (this->_Path).Size;
  iVar1 = (this->_Path).Capacity;
  if (iVar6 == iVar1) {
    iVar6 = iVar6 + 1;
    if (iVar1 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar1 / 2 + iVar1;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar1 < iVar6) {
      pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
      pIVar2 = (this->_Path).Data;
      if (pIVar2 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar2,(long)(this->_Path).Size << 3);
      }
      ImGui::MemFree((this->_Path).Data);
      (this->_Path).Data = pIVar4;
      (this->_Path).Capacity = iVar6;
    }
  }
  iVar6 = (this->_Path).Size;
  (this->_Path).Size = iVar6 + 1;
  (this->_Path).Data[iVar6] = *a;
  fVar8 = b->x;
  fVar9 = a->y;
  iVar6 = (this->_Path).Size;
  iVar1 = (this->_Path).Capacity;
  if (iVar6 == iVar1) {
    iVar6 = iVar6 + 1;
    if (iVar1 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar1 / 2 + iVar1;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar1 < iVar6) {
      pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
      pIVar2 = (this->_Path).Data;
      if (pIVar2 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar2,(long)(this->_Path).Size << 3);
      }
      ImGui::MemFree((this->_Path).Data);
      (this->_Path).Data = pIVar4;
      (this->_Path).Capacity = iVar6;
    }
  }
  pIVar2 = (this->_Path).Data;
  iVar6 = (this->_Path).Size;
  (this->_Path).Size = iVar6 + 1;
  pIVar2[iVar6].x = fVar8;
  pIVar2[iVar6].y = fVar9;
  iVar6 = (this->_Path).Size;
  iVar1 = (this->_Path).Capacity;
  if (iVar6 == iVar1) {
    iVar6 = iVar6 + 1;
    if (iVar1 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar1 / 2 + iVar1;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar1 < iVar6) {
      pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
      pIVar2 = (this->_Path).Data;
      if (pIVar2 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar2,(long)(this->_Path).Size << 3);
      }
      ImGui::MemFree((this->_Path).Data);
      (this->_Path).Data = pIVar4;
      (this->_Path).Capacity = iVar6;
    }
  }
  iVar6 = (this->_Path).Size;
  (this->_Path).Size = iVar6 + 1;
  (this->_Path).Data[iVar6] = *b;
  fVar8 = a->x;
  fVar9 = b->y;
  iVar6 = (this->_Path).Size;
  iVar1 = (this->_Path).Capacity;
  if (iVar6 == iVar1) {
    iVar6 = iVar6 + 1;
    if (iVar1 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar1 / 2 + iVar1;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar1 < iVar6) {
      pIVar4 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 << 3);
      pIVar2 = (this->_Path).Data;
      if (pIVar2 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar2,(long)(this->_Path).Size << 3);
      }
      ImGui::MemFree((this->_Path).Data);
      (this->_Path).Data = pIVar4;
      (this->_Path).Capacity = iVar6;
    }
  }
  pIVar2 = (this->_Path).Data;
  iVar6 = (this->_Path).Size;
  (this->_Path).Size = iVar6 + 1;
  pIVar2[iVar6].x = fVar8;
  pIVar2[iVar6].y = fVar9;
  return;
}

Assistant:

void ImDrawList::PathRect(const ImVec2& a, const ImVec2& b, float rounding, int rounding_corners)
{
    float r = rounding;
    r = ImMin(r, fabsf(b.x-a.x) * ( ((rounding_corners&(1|2))==(1|2)) || ((rounding_corners&(4|8))==(4|8)) ? 0.5f : 1.0f ) - 1.0f);
    r = ImMin(r, fabsf(b.y-a.y) * ( ((rounding_corners&(1|8))==(1|8)) || ((rounding_corners&(2|4))==(2|4)) ? 0.5f : 1.0f ) - 1.0f);

    if (r <= 0.0f || rounding_corners == 0)
    {
        PathLineTo(a);
        PathLineTo(ImVec2(b.x,a.y));
        PathLineTo(b);
        PathLineTo(ImVec2(a.x,b.y));
    }
    else
    {
        const float r0 = (rounding_corners & 1) ? r : 0.0f;
        const float r1 = (rounding_corners & 2) ? r : 0.0f;
        const float r2 = (rounding_corners & 4) ? r : 0.0f;
        const float r3 = (rounding_corners & 8) ? r : 0.0f;
        PathArcToFast(ImVec2(a.x+r0,a.y+r0), r0, 6, 9);
        PathArcToFast(ImVec2(b.x-r1,a.y+r1), r1, 9, 12);
        PathArcToFast(ImVec2(b.x-r2,b.y-r2), r2, 0, 3);
        PathArcToFast(ImVec2(a.x+r3,b.y-r3), r3, 3, 6);
    }
}